

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRHeadTrackingNode::render
          (VRHeadTrackingNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRDataIndex *in_RSI;
  VRDataIndex *in_RDI;
  VRDataIndex *this_00;
  allocator<char> local_b1;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  VRFloatArrayConvertible *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  VRDataIndex *in_stack_ffffffffffffff78;
  undefined1 local_59 [33];
  string local_38 [56];
  
  local_38._40_8_ = in_RSI;
  VRDataIndex::pushState(in_RDI);
  this_00 = (VRDataIndex *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  VRDataIndex::addData
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  VRDataIndex::addData
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator(&local_b1);
  VRDisplayNode::render
            ((VRDisplayNode *)this_00,(VRDataIndex *)local_38._40_8_,(VRRenderHandler *)in_RDI);
  VRDataIndex::popState(this_00);
  return;
}

Assistant:

void
VRHeadTrackingNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	renderState->addData("HeadMatrix", _headMatrix);

  // We copy the head matrix into "CameraMatrix" in case this is only a mono
  // configuration and the two are the same thing.  We don't use a link because
  // a stereo configuration will overwrite the camera matrix.
	renderState->addData("CameraMatrix", _headMatrix);
	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}